

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O2

wchar_t mb_to_wc(wchar_t codepage,wchar_t flags,char *mbstr,wchar_t mblen,wchar_t *wcstr,
                wchar_t wclen)

{
  wchar_t wVar1;
  size_t sVar2;
  ulong uVar3;
  mbstate_t state;
  wchar_t local_44;
  char *local_40;
  mbstate_t local_38;
  
  local_44 = mblen;
  local_40 = mbstr;
  if (codepage == L'\xffff') {
    local_38.__count = 0;
    local_38.__value = (_union_27)0x0;
    for (uVar3 = 0; (L'\0' < mblen && ((long)uVar3 < (long)wclen)); uVar3 = uVar3 + 1) {
      sVar2 = mbrtowc(wcstr,mbstr,(ulong)(uint)mblen,&local_38);
      if (0xfffffffffffffffd < sVar2) break;
      mbstr = mbstr + sVar2;
      mblen = mblen - (int)sVar2;
      wcstr = wcstr + 1;
    }
  }
  else if (codepage == L'\0') {
    for (uVar3 = 0; (L'\0' < mblen && ((long)uVar3 < (long)wclen)); uVar3 = uVar3 + 1) {
      wcstr[uVar3] = (byte)mbstr[uVar3] | 0xd800;
      mblen = mblen + L'\xffffffff';
    }
  }
  else {
    wVar1 = charset_to_unicode(&local_40,&local_44,wcstr,wclen,codepage,(charset_state *)0x0,
                               (wchar_t *)0x0,L'\0');
    uVar3 = (ulong)(uint)wVar1;
  }
  return (wchar_t)uVar3;
}

Assistant:

int mb_to_wc(int codepage, int flags, const char *mbstr, int mblen,
             wchar_t *wcstr, int wclen)
{
    if (codepage == DEFAULT_CODEPAGE) {
        int n = 0;
        mbstate_t state;

        memset(&state, 0, sizeof state);

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            size_t i = mbrtowc(wcstr+n, mbstr, (size_t)mblen, &state);
            if (i == (size_t)-1 || i == (size_t)-2)
                break;
            n++;
            mbstr += i;
            mblen -= i;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            wcstr[n] = 0xD800 | (mbstr[0] & 0xFF);
            n++;
            mbstr++;
            mblen--;
        }

        return n;
    } else
        return charset_to_unicode(&mbstr, &mblen, wcstr, wclen, codepage,
                                  NULL, NULL, 0);
}